

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation_deltaeta
          (singleParticleSpectra *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  double *pdVar4;
  void *pvVar5;
  int j;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int j_1;
  long lVar12;
  ulong uVar13;
  double dVar14;
  
  uVar1 = this->N_rap;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (long)(int)uVar1) {
    uVar9 = (long)(int)uVar1 * 8;
  }
  pvVar5 = operator_new__(uVar9);
  uVar9 = 0;
  uVar13 = 0;
  if (0 < (int)uVar1) {
    uVar13 = (ulong)uVar1;
  }
  uVar6 = (ulong)(uint)this->order_max;
  if (this->order_max < 1) {
    uVar6 = uVar9;
  }
  for (; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
      *(undefined8 *)((long)pvVar5 + uVar7 * 8) = 0;
    }
    pvVar2 = (event_Qn_diff_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (event_Qn_diff_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar10 = -(int)(this->rapidity_dis_min / this->drap);
    lVar12 = 0;
    for (uVar7 = 0; uVar7 != uVar13; uVar7 = uVar7 + 1) {
      uVar11 = uVar10;
      for (lVar8 = 0; (ulong)uVar1 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
        if ((int)uVar11 < (int)uVar1 && -1 < (int)uVar11) {
          pdVar4 = pvVar2[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar14 = pdVar4[uVar9] *
                   *(double *)
                    (*(long *)((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data + lVar8) + uVar9 * 8) +
                   *(double *)
                    (*(long *)&pvVar3[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data + uVar9 * 8) *
                   *(double *)
                    (*(long *)((long)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data + lVar8) + uVar9 * 8);
          if (lVar12 == lVar8) {
            dVar14 = dVar14 - *pdVar4;
          }
          *(double *)((long)pvVar5 + (ulong)uVar11 * 8) =
               dVar14 + *(double *)((long)pvVar5 + (ulong)uVar11 * 8);
        }
        uVar11 = uVar11 - 1;
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x18;
    }
    pvVar2 = (this->QnSP_eta12).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->QnSP_eta12_err).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
      dVar14 = *(double *)((long)pvVar5 + uVar7 * 8);
      lVar12 = *(long *)&pvVar2[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data;
      *(double *)(lVar12 + uVar7 * 8) = *(double *)(lVar12 + uVar7 * 8) + dVar14;
      lVar12 = *(long *)&pvVar3[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data;
      *(double *)(lVar12 + uVar7 * 8) = dVar14 * dVar14 + *(double *)(lVar12 + uVar7 * 8);
    }
  }
  operator_delete__(pvVar5);
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation_deltaeta(
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_imag) {
    double *temp_corr = new double[N_rap];
    for (int i = 0; i < order_max; i++) {
        for (int j = 0; j < N_rap; j++) {
            temp_corr[j] = 0.0;
        }
        for (int ii = 0; ii < N_rap; ii++) {
            for (int jj = 0; jj < N_rap; jj++) {
                int rap_idx =
                    ((ii - jj) - static_cast<int>(rapidity_dis_min / drap));
                if (rap_idx >= 0 && rap_idx < N_rap) {
                    double QnSP_rap_local =
                        (event_Qn_diff_real[ii][i] * event_Qn_diff_real[jj][i]
                         + event_Qn_diff_imag[ii][i]
                               * event_Qn_diff_imag[jj][i]);
                    if (ii == jj) {
                        QnSP_rap_local -= event_Qn_diff_real[ii][0];
                    }
                    temp_corr[rap_idx] += QnSP_rap_local;
                }
            }
        }
        for (int j = 0; j < N_rap; j++) {
            QnSP_eta12[i][j] += temp_corr[j];
            QnSP_eta12_err[i][j] += temp_corr[j] * temp_corr[j];
        }
    }
    delete[] temp_corr;
}